

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  undefined8 in_RAX;
  undefined4 in_register_00000014;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/window.c"
                  ,0x229,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/window.c"
                  ,0x22a,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/window.c"
                  ,0x22b,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized != 0) {
    *(int *)(handle + 0x28) = width;
    *(int *)(handle + 0x2c) = height;
    _glfwPlatformSetWindowSize((_GLFWwindow *)handle,width,height);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0,CONCAT44(in_register_00000014,height),in_RAX);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    window->videoMode.width  = width;
    window->videoMode.height = height;

    _glfwPlatformSetWindowSize(window, width, height);
}